

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# battle_check.cpp
# Opt level: O2

int reflect_damage(int *reflect,int damage)

{
  double dVar1;
  int iVar2;
  ostream *poVar3;
  
  iVar2 = *reflect;
  poVar3 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar3 = std::operator<<(poVar3,anon_var_dwarf_15a1e);
  dVar1 = *(double *)(&DAT_0010d8b8 + (ulong)(iVar2 == 2) * 8);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,(int)((double)damage * dVar1));
  poVar3 = std::operator<<(poVar3,anon_var_dwarf_15a34);
  std::endl<char,std::char_traits<char>>(poVar3);
  return (int)((double)damage * dVar1);
}

Assistant:

int reflect_damage(int* reflect,int damage)
{
    if(*reflect==2)
    {
        damage *= 0.4;
        cout<<endl<<"勇者受到 "<<damage<<" 點反彈傷害"<<endl;
        return damage;
    }
    else
    {
        damage *= 0.4*2;
        cout<<endl<<"勇者受到 "<<damage<<" 點反彈傷害"<<endl;
        return damage;
    }
}